

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O2

weak_ptr<squall::detail::KlassImp<Foo>_> __thiscall
squall::KlassTable::add_klass<Foo,void>(KlassTable *this,HSQUIRRELVM vm,string *name)

{
  iterator iVar1;
  __shared_ptr<squall::detail::KlassImpBase,(__gnu_cxx::_Lock_policy)2> *this_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  weak_ptr<squall::detail::KlassImp<Foo>_> wVar2;
  shared_ptr<squall::detail::KlassImp<Foo>_> p;
  size_t h;
  __shared_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __node_base local_28;
  
  local_28._M_nxt = (_Hash_node_base *)detail::KlassImp<Foo>::hash();
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)vm,(key_type *)&local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    KlassAdd<Foo,_void>::doit((klasses_type *)&_Stack_38,vm,name);
    this_00 = (__shared_ptr<squall::detail::KlassImpBase,(__gnu_cxx::_Lock_policy)2> *)
              std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)vm,(key_type *)&local_28);
    std::__shared_ptr<squall::detail::KlassImpBase,(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&_Stack_38);
  }
  else {
    std::dynamic_pointer_cast<squall::detail::KlassImp<Foo>,squall::detail::KlassImpBase>
              ((shared_ptr<squall::detail::KlassImpBase> *)&_Stack_38);
  }
  std::__weak_ptr<squall::detail::KlassImp<Foo>,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<squall::detail::KlassImp<Foo>,void>
            ((__weak_ptr<squall::detail::KlassImp<Foo>,(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_38
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  wVar2.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  wVar2.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<squall::detail::KlassImp<Foo>_>)
         wVar2.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<detail::KlassImp<typename std::remove_cv<C>::type>>
    add_klass(HSQUIRRELVM vm, const string& name) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            auto p = KlassAdd<CC, Base>::doit(klasses_, vm, name);
            klasses_[h] = p;
            return p;
        } else {
            return std::dynamic_pointer_cast<detail::KlassImp<CC>>(
                (*i).second);
        }
    }